

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O2

void __thiscall HdmiCecAnalyzerResults::GenACKBubble(HdmiCecAnalyzerResults *this,Frame *frame)

{
  long lVar1;
  char *pcVar2;
  allocator local_51;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  lVar1 = *(long *)(frame + 0x10);
  if (this->mTabular == false) {
    std::__cxx11::string::string((string *)&local_50,"A",(allocator *)&local_30);
    AddResult(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pcVar2 = "A=1";
    if (lVar1 == 0) {
      pcVar2 = "A=0";
    }
    std::__cxx11::string::string((string *)&local_50,pcVar2,(allocator *)&local_30);
    AddResult(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pcVar2 = "ACK=1";
    if (lVar1 == 0) {
      pcVar2 = "ACK=0";
    }
    std::__cxx11::string::string((string *)&local_50,pcVar2,(allocator *)&local_30);
    AddResult(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pcVar2 = "A=1";
  if (lVar1 == 0) {
    pcVar2 = "A=0";
  }
  std::__cxx11::string::string((string *)&local_30,pcVar2 + 2,&local_51);
  std::operator+(&local_50,"Acknowledgment = ",&local_30);
  AddResult(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenACKBubble( const Frame& frame )
{
    bool ack = frame.mData1;

    if( !mTabular )
    {
        AddResult( "A" );
        AddResult( ack ? "A=1" : "A=0" );
        AddResult( ack ? "ACK=1" : "ACK=0" );
    }
    AddResult( "Acknowledgment = " + std::string( ack ? "1" : "0" ) );
}